

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  __m128 afVar10;
  __m128 _outp_14;
  __m128 _p_14;
  __m256 _outp_13;
  __m256 _p_13;
  __m512 _outp_12;
  __m512 _p_12;
  int i_4;
  __m512 _b_512_4;
  __m256 _b_256_4;
  __m128 _b_128_4;
  float _b_4;
  int y_2;
  float *ptr1_2;
  int z_1;
  int size_4;
  float *outptr_4;
  float *ptr_4;
  int q_3;
  __m128 _outp_11;
  __m128 _p_11;
  __m256 _outp_10;
  __m256 _p_10;
  __m512 _outp_9;
  __m512 _p_9;
  int i_3;
  __m512 _b_512_3;
  __m256 _b_256_3;
  __m128 _b_128_3;
  float _b_3;
  int z;
  int size_3;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  __m128 _outp_8;
  __m128 _p_8;
  __m256 _outp_7;
  __m256 _p_7;
  __m512 _outp_6;
  __m512 _p_6;
  int i_2;
  __m512 _b_512_2;
  __m256 _b_256_2;
  __m128 _b_128_2;
  float _b_2;
  int y_1;
  int size_2;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  __m128 _outp_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _p_3;
  int i_1;
  int size_1;
  __m512 _b_512_1;
  __m256 _b_256_1;
  __m128 _b_128_1;
  float _b_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  __m128 _outp_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p;
  int i;
  int size;
  __m512 _b_512;
  __m256 _b_256;
  __m128 _b_128;
  float _b;
  float *outptr;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rpow op;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  __m256 *y_00;
  undefined8 uStack_1d68;
  undefined1 local_1d80 [64];
  undefined8 uStack_1d48;
  undefined1 local_1d40 [32];
  float local_1d10 [2];
  float afStack_1d08 [34];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [32];
  float local_1c20 [2];
  float afStack_1c18 [22];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [32];
  float local_1b60 [2];
  float afStack_1b58 [22];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [32];
  float local_1aa0 [2];
  float afStack_1a98 [22];
  undefined1 local_1a40 [64];
  undefined1 local_19e0 [32];
  float local_19b0 [2];
  float afStack_19a8 [6];
  float local_1990 [2];
  float afStack_1988 [2];
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  int local_1884;
  __m256 *local_1880;
  binary_op_rpow *pbStack_1878;
  binary_op_rpow *pbStack_1870;
  undefined8 uStack_1868;
  __m512 *pafStack_1860;
  __m512 *pafStack_1858;
  binary_op_rpow *pbStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float local_1800 [2];
  float afStack_17f8 [4];
  float local_17e8;
  int local_17e4;
  undefined8 local_17e0;
  undefined8 local_17d8;
  undefined8 local_17d0;
  undefined4 local_17c8;
  long local_17c0;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined8 local_17a0;
  long local_1798;
  int local_1790;
  int local_178c;
  undefined8 local_1788;
  undefined8 local_1780;
  undefined8 local_1778;
  undefined4 local_1770;
  long local_1768;
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined8 local_1748;
  float *local_1740;
  undefined8 local_1738;
  undefined8 local_1730;
  undefined8 local_1728;
  undefined4 local_1720;
  long local_1718;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined4 local_1700;
  undefined8 local_16f8;
  float *local_16f0;
  int local_16e4;
  undefined8 local_16e0;
  float afStack_16d8 [2];
  float local_16d0 [2];
  float afStack_16c8 [2];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  int local_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1530 [2];
  float afStack_1528 [3];
  float local_151c;
  int local_1518;
  int local_1514;
  undefined8 local_1510;
  undefined8 local_1508;
  undefined8 local_1500;
  undefined4 local_14f8;
  long local_14f0;
  undefined4 local_14e8;
  undefined4 local_14e4;
  undefined4 local_14e0;
  undefined4 local_14dc;
  undefined4 local_14d8;
  undefined8 local_14d0;
  float *local_14c8;
  long local_14c0;
  undefined8 local_14b8;
  undefined8 local_14b0;
  undefined8 local_14a8;
  undefined4 local_14a0;
  long local_1498;
  undefined4 local_1490;
  undefined4 local_148c;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined8 local_1478;
  float *local_1470;
  int local_1464;
  undefined8 local_1460;
  float afStack_1458 [2];
  float local_1450 [2];
  float afStack_1448 [2];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  int local_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12b0 [2];
  float afStack_12a8 [3];
  float local_129c;
  int local_1298;
  int local_1294;
  undefined8 local_1290;
  undefined8 local_1288;
  undefined8 local_1280;
  undefined4 local_1278;
  long local_1270;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined4 local_1260;
  undefined4 local_125c;
  undefined4 local_1258;
  undefined8 local_1250;
  float *local_1248;
  long local_1240;
  undefined8 local_1238;
  undefined8 local_1230;
  undefined8 local_1228;
  undefined4 local_1220;
  long local_1218;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined4 local_1200;
  undefined8 local_11f8;
  float *local_11f0;
  int local_11e4;
  undefined8 local_11e0;
  float afStack_11d8 [2];
  float local_11d0 [2];
  float afStack_11c8 [2];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  int local_10c8;
  int local_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060 [2];
  float afStack_1058 [3];
  float local_104c;
  undefined8 local_1048;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined4 local_1030;
  long local_1028;
  undefined4 local_1020;
  undefined4 local_101c;
  undefined4 local_1018;
  undefined4 local_1014;
  undefined4 local_1010;
  undefined8 local_1008;
  float *local_1000;
  undefined8 local_ff8;
  undefined8 local_ff0;
  undefined8 local_fe8;
  undefined4 local_fe0;
  long local_fd8;
  undefined4 local_fd0;
  undefined4 local_fcc;
  undefined4 local_fc8;
  undefined4 local_fc4;
  undefined4 local_fc0;
  undefined8 local_fb8;
  float *local_fb0;
  int local_fa4;
  undefined8 local_fa0;
  float afStack_f98 [2];
  float local_f90 [2];
  float afStack_f88 [2];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  int local_e88;
  int local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_df0 [2];
  float afStack_de8 [3];
  float local_ddc;
  float *local_dd8;
  float *local_dd0;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  int local_db8;
  int local_db4;
  int local_db0;
  binary_op_rpow local_da9 [9];
  long *local_da0;
  long *local_d98;
  long *local_d90;
  long local_d88;
  long local_d78;
  long *local_d70;
  undefined1 local_d65;
  int local_d64;
  undefined8 *local_d58;
  undefined1 local_d4d;
  int local_d4c;
  undefined8 *local_d40;
  undefined1 local_d35;
  int local_d34;
  undefined8 *local_d28;
  undefined1 local_d1d;
  int local_d1c;
  undefined8 *local_d10;
  undefined1 local_d05;
  int local_d04;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cc0;
  long *local_cb8;
  long *local_cb0;
  long *local_ca8;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  undefined8 *local_c40;
  undefined8 *local_c38;
  undefined1 local_c2d;
  int local_c2c;
  undefined8 *local_c20;
  undefined1 local_c0d;
  int local_c0c;
  undefined8 *local_c00;
  undefined1 local_bed;
  int local_bec;
  undefined8 *local_be0;
  undefined1 local_bcd;
  int local_bcc;
  undefined8 *local_bc0;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  float *local_b90;
  undefined1 (*local_b88) [64];
  float *local_b80;
  undefined1 (*local_b78) [64];
  float *local_b70;
  undefined1 (*local_b68) [64];
  float *local_b60;
  undefined1 (*local_b58) [64];
  float *local_b50;
  undefined1 (*local_b48) [64];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  float *local_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float *local_8f8;
  float *local_8f0;
  undefined1 (*local_8e8) [32];
  float *local_8e0;
  undefined1 (*local_8d8) [32];
  float *local_8d0;
  undefined1 (*local_8c8) [32];
  float *local_8c0;
  undefined1 (*local_8b8) [32];
  float *local_8b0;
  undefined1 (*local_8a8) [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float *local_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float *local_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float *local_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float *local_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float *local_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float local_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float local_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float local_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_6cc;
  long local_6c8;
  undefined4 local_6bc;
  long local_6b8;
  float *local_6b0;
  undefined4 local_6a4;
  int local_6a0;
  int local_69c;
  undefined8 *local_698;
  long local_690;
  undefined4 local_684;
  long local_680;
  float *local_678;
  undefined4 local_66c;
  int local_668;
  int local_664;
  undefined8 *local_660;
  long local_658;
  undefined4 local_64c;
  long local_648;
  float *local_640;
  undefined4 local_634;
  int local_630;
  int local_62c;
  undefined8 *local_628;
  long local_620;
  undefined4 local_614;
  long local_610;
  float *local_608;
  undefined4 local_5fc;
  int local_5f8;
  int local_5f4;
  undefined8 *local_5f0;
  long local_5e8;
  undefined4 local_5dc;
  long local_5d8;
  float *local_5d0;
  undefined4 local_5c4;
  int local_5c0;
  int local_5bc;
  undefined8 *local_5b8;
  long local_5b0;
  undefined4 local_5a4;
  long local_5a0;
  float *local_598;
  undefined4 local_58c;
  int local_588;
  int local_584;
  undefined8 *local_580;
  long local_578;
  undefined4 local_56c;
  long local_568;
  float *local_560;
  undefined4 local_554;
  int local_550;
  int local_54c;
  undefined8 *local_548;
  long local_540;
  undefined4 local_534;
  long local_530;
  float *local_528;
  undefined4 local_51c;
  int local_518;
  int local_514;
  undefined8 *local_510;
  long local_508;
  undefined4 local_4fc;
  long local_4f8;
  long local_4f0;
  undefined4 local_4e4;
  int local_4e0;
  int local_4dc;
  undefined8 *local_4d8;
  undefined4 local_4cc;
  long local_4c8;
  undefined4 local_4bc;
  long local_4b8;
  undefined4 local_4ac;
  long local_4a8;
  undefined4 local_49c;
  long local_498;
  undefined4 local_48c;
  long local_488;
  undefined4 local_47c;
  long local_478;
  undefined4 local_46c;
  long local_468;
  undefined4 local_45c;
  long local_458;
  undefined4 local_44c;
  long local_448;
  undefined8 *local_3f8;
  undefined8 *local_3e8;
  undefined8 *local_3d8;
  undefined8 *local_3c8;
  undefined8 *local_3b8;
  undefined8 *local_3a8;
  undefined8 *local_398;
  undefined8 *local_388;
  undefined8 *local_378;
  int local_28c;
  undefined8 *local_288;
  int local_27c;
  int local_26c;
  int local_25c;
  long *local_258;
  int local_24c;
  long *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0 [2];
  float afStack_1c8 [2];
  float local_1c0 [2];
  float afStack_1b8 [2];
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_f0;
  float afStack_e8 [4];
  float *local_d8;
  undefined8 local_d0;
  float afStack_c8 [4];
  float *local_b8;
  undefined8 local_b0;
  float afStack_a8 [4];
  float *local_98;
  undefined8 local_90;
  float afStack_88 [4];
  float *local_78;
  undefined8 local_70;
  float afStack_68 [4];
  float *local_58;
  binary_op_rpow *this;
  binary_op_rpow *this_00;
  __m512 *y_01;
  __m512 *x;
  binary_op_rpow *this_01;
  
  local_db0 = *(int *)((long)in_RDI + 0x2c);
  local_db4 = (int)in_RDI[6];
  local_db8 = *(int *)((long)in_RDI + 0x34);
  local_dbc = (int)in_RDI[7];
  local_dc0 = (int)in_RDI[3];
  local_da0 = in_RDX;
  local_d98 = in_RSI;
  local_d90 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_dc4 = 0; local_dc4 < local_db4; local_dc4 = local_dc4 + 1) {
      local_258 = local_d90;
      local_25c = local_dc4;
      local_dd0 = (float *)(*local_d90 +
                           (long)*(int *)((long)local_d90 + 0x2c) * (long)local_dc4 * local_d90[2]);
      local_248 = local_da0;
      local_24c = local_dc4;
      local_dd8 = (float *)(*local_da0 +
                           (long)*(int *)((long)local_da0 + 0x2c) * (long)local_dc4 * local_da0[2]);
      local_d78 = (long)local_dc4;
      local_d70 = local_d98;
      local_ddc = *(float *)(*local_d98 + local_d78 * 4);
      if (local_dc0 == 4) {
        local_ca8 = local_d98;
        local_1f8 = (float *)(*local_d98 + (long)(local_dc4 << 2) * 4);
        local_19b0 = *(float (*) [2])local_1f8;
        afStack_19a8._0_8_ = *(undefined8 *)(local_1f8 + 2);
      }
      else {
        local_19b0[1] = local_ddc;
        local_19b0[0] = local_ddc;
        afStack_19a8[1] = local_ddc;
        afStack_19a8[0] = local_ddc;
        local_6e0 = local_ddc;
        fStack_6dc = local_ddc;
        fStack_6d8 = local_ddc;
        fStack_6d4 = local_ddc;
        local_6cc = local_ddc;
      }
      local_df0[0] = local_19b0[0];
      local_df0[1] = local_19b0[1];
      afStack_de8[0] = afStack_19a8[0];
      afStack_de8[1] = afStack_19a8[1];
      if (local_dc0 == 8) {
        local_cb0 = local_d98;
        local_8a8 = (undefined1 (*) [32])(*local_d98 + (long)(local_dc4 << 3) * 4);
        local_19e0 = *local_8a8;
      }
      else {
        local_1b0[0] = local_19b0[0];
        local_1b0[1] = local_19b0[1];
        afStack_1a8[0] = afStack_19a8[0];
        afStack_1a8[1] = afStack_19a8[1];
        local_19e0._8_4_ = afStack_19a8[0];
        local_19e0._12_4_ = afStack_19a8[1];
        local_19e0._0_4_ = local_19b0[0];
        local_19e0._4_4_ = local_19b0[1];
        local_19e0._24_4_ = afStack_19a8[0];
        local_19e0._28_4_ = afStack_19a8[1];
        local_19e0._16_4_ = local_19b0[0];
        local_19e0._20_4_ = local_19b0[1];
      }
      local_e20 = local_19e0._0_8_;
      uStack_e18 = local_19e0._8_8_;
      uStack_e10 = local_19e0._16_8_;
      uStack_e08 = local_19e0._24_8_;
      if (local_dc0 == 0x10) {
        local_cb8 = local_d98;
        local_b48 = (undefined1 (*) [64])(*local_d98 + (long)(local_dc4 << 4) * 4);
        local_1a40 = *local_b48;
      }
      else {
        local_120 = local_19e0._0_8_;
        uStack_118 = local_19e0._8_8_;
        uStack_110 = local_19e0._16_8_;
        uStack_108 = local_19e0._24_8_;
        local_1a40 = vinsertf64x4_avx512f(ZEXT3264(local_19e0),local_19e0,1);
      }
      local_e80 = local_1a40._0_8_;
      uStack_e78 = local_1a40._8_8_;
      uStack_e70 = local_1a40._16_8_;
      uStack_e68 = local_1a40._24_8_;
      uStack_e60 = local_1a40._32_8_;
      uStack_e58 = local_1a40._40_8_;
      uStack_e50 = local_1a40._48_8_;
      uStack_e48 = local_1a40._56_8_;
      local_e84 = local_db0 * local_dc0;
      for (local_e88 = 0; local_e88 + 0xf < local_e84; local_e88 = local_e88 + 0x10) {
        local_b50 = local_dd0;
        uVar3 = *(undefined8 *)local_dd0;
        uVar2 = *(undefined8 *)(local_dd0 + 2);
        uVar4 = *(undefined8 *)(local_dd0 + 4);
        uVar5 = *(undefined8 *)(local_dd0 + 6);
        uVar6 = *(undefined8 *)(local_dd0 + 8);
        uVar7 = *(undefined8 *)(local_dd0 + 10);
        uVar8 = *(undefined8 *)(local_dd0 + 0xc);
        uVar9 = *(undefined8 *)(local_dd0 + 0xe);
        local_f00 = uVar3;
        uStack_ef8 = uVar2;
        uStack_ef0 = uVar4;
        uStack_ee8 = uVar5;
        uStack_ee0 = uVar6;
        uStack_ed8 = uVar7;
        uStack_ed0 = uVar8;
        uStack_ec8 = uVar9;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16(this_01,x,y_01);
        local_8f8 = local_dd8;
        *(undefined8 *)local_dd8 = uVar3;
        *(undefined8 *)(local_dd8 + 2) = uVar2;
        *(undefined8 *)(local_dd8 + 4) = uVar4;
        *(undefined8 *)(local_dd8 + 6) = uVar5;
        *(undefined8 *)(local_dd8 + 8) = uVar6;
        *(undefined8 *)(local_dd8 + 10) = uVar7;
        *(undefined8 *)(local_dd8 + 0xc) = uVar8;
        *(undefined8 *)(local_dd8 + 0xe) = uVar9;
        local_dd0 = local_dd0 + 0x10;
        local_dd8 = local_dd8 + 0x10;
        local_f40 = uVar3;
        uStack_f38 = uVar2;
        uStack_f30 = uVar4;
        uStack_f28 = uVar5;
        uStack_f20 = uVar6;
        uStack_f18 = uVar7;
        uStack_f10 = uVar8;
        uStack_f08 = uVar9;
        local_940 = uVar3;
        uStack_938 = uVar2;
        uStack_930 = uVar4;
        uStack_928 = uVar5;
        uStack_920 = uVar6;
        uStack_918 = uVar7;
        uStack_910 = uVar8;
        uStack_908 = uVar9;
      }
      for (; local_e88 + 7 < local_e84; local_e88 = local_e88 + 8) {
        local_8b0 = local_dd0;
        uVar3 = *(undefined8 *)local_dd0;
        uVar2 = *(undefined8 *)(local_dd0 + 2);
        uVar4 = *(undefined8 *)(local_dd0 + 4);
        uVar5 = *(undefined8 *)(local_dd0 + 6);
        local_f60 = uVar3;
        uStack_f58 = uVar2;
        uStack_f50 = uVar4;
        uStack_f48 = uVar5;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8(this_00,(__m256 *)this,y_00);
        local_768 = local_dd8;
        *(undefined8 *)local_dd8 = uVar3;
        *(undefined8 *)(local_dd8 + 2) = uVar2;
        *(undefined8 *)(local_dd8 + 4) = uVar4;
        *(undefined8 *)(local_dd8 + 6) = uVar5;
        local_dd0 = local_dd0 + 8;
        local_dd8 = local_dd8 + 8;
        local_f80 = uVar3;
        uStack_f78 = uVar2;
        uStack_f70 = uVar4;
        uStack_f68 = uVar5;
        local_7a0 = uVar3;
        uStack_798 = uVar2;
        uStack_790 = uVar4;
        uStack_788 = uVar5;
      }
      for (; local_e88 + 3 < local_e84; local_e88 = local_e88 + 4) {
        local_200 = local_dd0;
        local_f90 = *(float (*) [2])local_dd0;
        uVar3 = *(undefined8 *)(local_dd0 + 2);
        afStack_f88 = (float  [2])uVar3;
        afVar10 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                            (local_da9,(__m128 *)local_f90,(__m128 *)local_df0);
        local_fa0 = afVar10._0_8_;
        local_58 = local_dd8;
        *(undefined8 *)local_dd8 = local_fa0;
        *(undefined8 *)(local_dd8 + 2) = uVar3;
        local_dd0 = local_dd0 + 4;
        local_dd8 = local_dd8 + 4;
        afStack_f98 = (float  [2])uVar3;
        local_70 = local_fa0;
        afStack_68._0_8_ = uVar3;
      }
      for (; local_e88 < local_e84; local_e88 = local_e88 + 1) {
        fVar1 = BinaryOp_x86_avx512_functor::binary_op_rpow::func(this,*y_00,(float *)0x10cd66f);
        *local_dd8 = fVar1;
        local_dd0 = local_dd0 + 1;
        local_dd8 = local_dd8 + 1;
      }
    }
  }
  if ((((int)local_d90[5] == 3) || ((int)local_d90[5] == 4)) && ((int)local_d98[5] == 1)) {
    for (local_fa4 = 0; local_fa4 < local_dbc; local_fa4 = local_fa4 + 1) {
      local_cf8 = &local_ff8;
      local_5bc = *(int *)((long)local_d90 + 0x2c);
      local_5c0 = (int)local_d90[6];
      local_5c4 = *(undefined4 *)((long)local_d90 + 0x34);
      local_fb0 = (float *)(*local_d90 + local_d90[8] * (long)local_fa4 * local_d90[2]);
      local_5d8 = local_d90[2];
      local_5dc = (undefined4)local_d90[3];
      local_5e8 = local_d90[4];
      local_5b8 = &local_ff8;
      local_488 = (long)local_5bc * (long)local_5c0 * local_5d8;
      local_cc0 = &local_ff8;
      local_c78 = &local_ff8;
      local_bc0 = &local_1048;
      local_69c = *(int *)((long)local_da0 + 0x2c);
      local_6a0 = (int)local_da0[6];
      local_6a4 = *(undefined4 *)((long)local_da0 + 0x34);
      local_1000 = (float *)(*local_da0 + local_da0[8] * (long)local_fa4 * local_da0[2]);
      local_6b8 = local_da0[2];
      local_6bc = (undefined4)local_da0[3];
      local_6c8 = local_da0[4];
      local_698 = &local_1048;
      local_448 = (long)local_69c * (long)local_6a0 * local_6b8;
      local_b98 = &local_1048;
      local_c70 = &local_1048;
      local_fc0 = 0;
      local_fc4 = 0;
      local_fc8 = 0;
      local_fcc = 0;
      local_fe0 = 0;
      local_fe8 = 0;
      local_ff0 = 0;
      local_ff8 = 0;
      local_44c = 0x10;
      local_48c = 0x10;
      local_bcc = local_fa4;
      local_bcd = 1;
      local_d04 = local_fa4;
      local_d05 = 1;
      local_fb8 = 0;
      local_fd0 = 0;
      local_1048 = 0;
      local_1038 = 0;
      local_1030 = 0;
      local_1020 = 0;
      local_101c = 0;
      local_1018 = 0;
      local_1014 = 0;
      local_1010 = 0;
      local_1008 = 0;
      local_1040 = 0;
      local_d88 = (long)local_fa4;
      local_104c = *(float *)(*local_d98 + local_d88 * 4);
      if (local_dc0 == 4) {
        local_208 = (float *)(*local_d98 + (long)(local_fa4 << 2) * 4);
        local_1aa0 = *(float (*) [2])local_208;
        afStack_1a98._0_8_ = *(undefined8 *)(local_208 + 2);
      }
      else {
        local_1aa0[1] = local_104c;
        local_1aa0[0] = local_104c;
        afStack_1a98[1] = local_104c;
        afStack_1a98[0] = local_104c;
        local_700 = local_104c;
        fStack_6fc = local_104c;
        fStack_6f8 = local_104c;
        fStack_6f4 = local_104c;
        local_6e4 = local_104c;
      }
      local_1060[0] = local_1aa0[0];
      local_1060[1] = local_1aa0[1];
      afStack_1058[0] = afStack_1a98[0];
      afStack_1058[1] = afStack_1a98[1];
      if (local_dc0 == 8) {
        local_8b8 = (undefined1 (*) [32])(*local_d98 + (long)(local_fa4 << 3) * 4);
        local_1ac0 = *local_8b8;
      }
      else {
        local_1c0[0] = local_1aa0[0];
        local_1c0[1] = local_1aa0[1];
        afStack_1b8[0] = afStack_1a98[0];
        afStack_1b8[1] = afStack_1a98[1];
        local_1ac0._8_4_ = afStack_1a98[0];
        local_1ac0._12_4_ = afStack_1a98[1];
        local_1ac0._0_4_ = local_1aa0[0];
        local_1ac0._4_4_ = local_1aa0[1];
        local_1ac0._24_4_ = afStack_1a98[0];
        local_1ac0._28_4_ = afStack_1a98[1];
        local_1ac0._16_4_ = local_1aa0[0];
        local_1ac0._20_4_ = local_1aa0[1];
      }
      local_1080 = local_1ac0._0_8_;
      uStack_1078 = local_1ac0._8_8_;
      uStack_1070 = local_1ac0._16_8_;
      uStack_1068 = local_1ac0._24_8_;
      if (local_dc0 == 0x10) {
        local_b58 = (undefined1 (*) [64])(*local_d98 + (long)(local_fa4 << 4) * 4);
        local_1b00 = *local_b58;
      }
      else {
        local_140 = local_1ac0._0_8_;
        uStack_138 = local_1ac0._8_8_;
        uStack_130 = local_1ac0._16_8_;
        uStack_128 = local_1ac0._24_8_;
        local_1b00 = vinsertf64x4_avx512f(ZEXT3264(local_1ac0),local_1ac0,1);
      }
      local_10c0 = local_1b00._0_8_;
      uStack_10b8 = local_1b00._8_8_;
      uStack_10b0 = local_1b00._16_8_;
      uStack_10a8 = local_1b00._24_8_;
      uStack_10a0 = local_1b00._32_8_;
      uStack_1098 = local_1b00._40_8_;
      uStack_1090 = local_1b00._48_8_;
      uStack_1088 = local_1b00._56_8_;
      local_10c4 = local_db0 * local_db4 * local_db8 * local_dc0;
      local_6b0 = local_1000;
      local_5d0 = local_fb0;
      local_388 = local_c70;
      local_378 = local_c78;
      local_1028 = local_6c8;
      local_fd8 = local_5e8;
      for (local_10c8 = 0; local_10c8 + 0xf < local_10c4; local_10c8 = local_10c8 + 0x10) {
        local_b60 = local_fb0;
        uVar3 = *(undefined8 *)local_fb0;
        uVar2 = *(undefined8 *)(local_fb0 + 2);
        uVar4 = *(undefined8 *)(local_fb0 + 4);
        uVar5 = *(undefined8 *)(local_fb0 + 6);
        uVar6 = *(undefined8 *)(local_fb0 + 8);
        uVar7 = *(undefined8 *)(local_fb0 + 10);
        uVar8 = *(undefined8 *)(local_fb0 + 0xc);
        uVar9 = *(undefined8 *)(local_fb0 + 0xe);
        local_1140 = uVar3;
        uStack_1138 = uVar2;
        uStack_1130 = uVar4;
        uStack_1128 = uVar5;
        uStack_1120 = uVar6;
        uStack_1118 = uVar7;
        uStack_1110 = uVar8;
        uStack_1108 = uVar9;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16(this_01,x,y_01);
        local_948 = local_1000;
        *(undefined8 *)local_1000 = uVar3;
        *(undefined8 *)(local_1000 + 2) = uVar2;
        *(undefined8 *)(local_1000 + 4) = uVar4;
        *(undefined8 *)(local_1000 + 6) = uVar5;
        *(undefined8 *)(local_1000 + 8) = uVar6;
        *(undefined8 *)(local_1000 + 10) = uVar7;
        *(undefined8 *)(local_1000 + 0xc) = uVar8;
        *(undefined8 *)(local_1000 + 0xe) = uVar9;
        local_fb0 = local_fb0 + 0x10;
        local_1000 = local_1000 + 0x10;
        local_1180 = uVar3;
        uStack_1178 = uVar2;
        uStack_1170 = uVar4;
        uStack_1168 = uVar5;
        uStack_1160 = uVar6;
        uStack_1158 = uVar7;
        uStack_1150 = uVar8;
        uStack_1148 = uVar9;
        local_9c0 = uVar3;
        uStack_9b8 = uVar2;
        uStack_9b0 = uVar4;
        uStack_9a8 = uVar5;
        uStack_9a0 = uVar6;
        uStack_998 = uVar7;
        uStack_990 = uVar8;
        uStack_988 = uVar9;
      }
      for (; local_10c8 + 7 < local_10c4; local_10c8 = local_10c8 + 8) {
        local_8c0 = local_fb0;
        uVar3 = *(undefined8 *)local_fb0;
        uVar2 = *(undefined8 *)(local_fb0 + 2);
        uVar4 = *(undefined8 *)(local_fb0 + 4);
        uVar5 = *(undefined8 *)(local_fb0 + 6);
        local_11a0 = uVar3;
        uStack_1198 = uVar2;
        uStack_1190 = uVar4;
        uStack_1188 = uVar5;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8(this_00,(__m256 *)this,y_00);
        local_7a8 = local_1000;
        *(undefined8 *)local_1000 = uVar3;
        *(undefined8 *)(local_1000 + 2) = uVar2;
        *(undefined8 *)(local_1000 + 4) = uVar4;
        *(undefined8 *)(local_1000 + 6) = uVar5;
        local_fb0 = local_fb0 + 8;
        local_1000 = local_1000 + 8;
        local_11c0 = uVar3;
        uStack_11b8 = uVar2;
        uStack_11b0 = uVar4;
        uStack_11a8 = uVar5;
        local_7e0 = uVar3;
        uStack_7d8 = uVar2;
        uStack_7d0 = uVar4;
        uStack_7c8 = uVar5;
      }
      for (; local_10c8 + 3 < local_10c4; local_10c8 = local_10c8 + 4) {
        local_210 = local_fb0;
        local_11d0 = *(float (*) [2])local_fb0;
        uVar3 = *(undefined8 *)(local_fb0 + 2);
        afStack_11c8 = (float  [2])uVar3;
        afVar10 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                            (local_da9,(__m128 *)local_11d0,(__m128 *)local_1060);
        local_11e0 = afVar10._0_8_;
        local_78 = local_1000;
        *(undefined8 *)local_1000 = local_11e0;
        *(undefined8 *)(local_1000 + 2) = uVar3;
        local_fb0 = local_fb0 + 4;
        local_1000 = local_1000 + 4;
        afStack_11d8 = (float  [2])uVar3;
        local_90 = local_11e0;
        afStack_88._0_8_ = uVar3;
      }
      for (; local_10c8 < local_10c4; local_10c8 = local_10c8 + 1) {
        fVar1 = BinaryOp_x86_avx512_functor::binary_op_rpow::func(this,*y_00,(float *)0x10ce4e4);
        *local_1000 = fVar1;
        local_fb0 = local_fb0 + 1;
        local_1000 = local_1000 + 1;
      }
    }
  }
  if (((int)local_d90[5] == 3) && ((int)local_d98[5] == 2)) {
    for (local_11e4 = 0; local_11e4 < local_dbc; local_11e4 = local_11e4 + 1) {
      local_d10 = &local_1238;
      local_584 = *(int *)((long)local_d90 + 0x2c);
      local_588 = (int)local_d90[6];
      local_58c = *(undefined4 *)((long)local_d90 + 0x34);
      local_11f0 = (float *)(*local_d90 + local_d90[8] * (long)local_11e4 * local_d90[2]);
      local_5a0 = local_d90[2];
      local_5a4 = (undefined4)local_d90[3];
      local_5b0 = local_d90[4];
      local_580 = &local_1238;
      local_498 = (long)local_584 * (long)local_588 * local_5a0;
      local_ce0 = &local_1238;
      local_c68 = &local_1238;
      local_1240 = *local_d98 +
                   (long)*(int *)((long)local_d98 + 0x2c) * (long)local_11e4 * local_d98[2];
      local_be0 = &local_1290;
      local_664 = *(int *)((long)local_da0 + 0x2c);
      local_668 = (int)local_da0[6];
      local_66c = *(undefined4 *)((long)local_da0 + 0x34);
      local_1248 = (float *)(*local_da0 + local_da0[8] * (long)local_11e4 * local_da0[2]);
      local_680 = local_da0[2];
      local_684 = (undefined4)local_da0[3];
      local_690 = local_da0[4];
      local_660 = &local_1290;
      local_458 = (long)local_664 * (long)local_668 * local_680;
      local_ba0 = &local_1290;
      local_c60 = &local_1290;
      local_1200 = 0;
      local_1204 = 0;
      local_1208 = 0;
      local_120c = 0;
      local_1220 = 0;
      local_1228 = 0;
      local_1230 = 0;
      local_1238 = 0;
      local_26c = local_11e4;
      local_45c = 0x10;
      local_49c = 0x10;
      local_bec = local_11e4;
      local_bed = 1;
      local_d1c = local_11e4;
      local_d1d = 1;
      local_11f8 = 0;
      local_1210 = 0;
      local_1290 = 0;
      local_1280 = 0;
      local_1278 = 0;
      local_1268 = 0;
      local_1264 = 0;
      local_1260 = 0;
      local_125c = 0;
      local_1258 = 0;
      local_1250 = 0;
      local_1288 = 0;
      local_1294 = local_db0 * local_dc0;
      local_678 = local_1248;
      local_598 = local_11f0;
      local_3a8 = local_c60;
      local_398 = local_c68;
      local_1270 = local_690;
      local_1218 = local_5b0;
      for (local_1298 = 0; local_1298 < local_db4; local_1298 = local_1298 + 1) {
        local_129c = *(float *)(local_1240 + (long)local_1298 * 4);
        if (local_dc0 == 4) {
          local_218 = (float *)(local_1240 + (long)(local_1298 << 2) * 4);
          local_1b60 = *(float (*) [2])local_218;
          afStack_1b58._0_8_ = *(undefined8 *)(local_218 + 2);
        }
        else {
          local_1b60[1] = local_129c;
          local_1b60[0] = local_129c;
          afStack_1b58[1] = local_129c;
          afStack_1b58[0] = local_129c;
          local_720 = local_129c;
          fStack_71c = local_129c;
          fStack_718 = local_129c;
          fStack_714 = local_129c;
          local_704 = local_129c;
        }
        local_12b0[0] = local_1b60[0];
        local_12b0[1] = local_1b60[1];
        afStack_12a8[0] = afStack_1b58[0];
        afStack_12a8[1] = afStack_1b58[1];
        if (local_dc0 == 8) {
          local_8c8 = (undefined1 (*) [32])(local_1240 + (long)(local_1298 << 3) * 4);
          local_1b80 = *local_8c8;
        }
        else {
          local_1d0[0] = local_1b60[0];
          local_1d0[1] = local_1b60[1];
          afStack_1c8[0] = afStack_1b58[0];
          afStack_1c8[1] = afStack_1b58[1];
          local_1b80._8_4_ = afStack_1b58[0];
          local_1b80._12_4_ = afStack_1b58[1];
          local_1b80._0_4_ = local_1b60[0];
          local_1b80._4_4_ = local_1b60[1];
          local_1b80._24_4_ = afStack_1b58[0];
          local_1b80._28_4_ = afStack_1b58[1];
          local_1b80._16_4_ = local_1b60[0];
          local_1b80._20_4_ = local_1b60[1];
        }
        local_12e0 = local_1b80._0_8_;
        uStack_12d8 = local_1b80._8_8_;
        uStack_12d0 = local_1b80._16_8_;
        uStack_12c8 = local_1b80._24_8_;
        if (local_dc0 == 0x10) {
          local_b68 = (undefined1 (*) [64])(local_1240 + (long)(local_1298 << 4) * 4);
          local_1bc0 = *local_b68;
        }
        else {
          local_160 = local_1b80._0_8_;
          uStack_158 = local_1b80._8_8_;
          uStack_150 = local_1b80._16_8_;
          uStack_148 = local_1b80._24_8_;
          local_1bc0 = vinsertf64x4_avx512f(ZEXT3264(local_1b80),local_1b80,1);
        }
        local_1340 = local_1bc0._0_8_;
        uStack_1338 = local_1bc0._8_8_;
        uStack_1330 = local_1bc0._16_8_;
        uStack_1328 = local_1bc0._24_8_;
        uStack_1320 = local_1bc0._32_8_;
        uStack_1318 = local_1bc0._40_8_;
        uStack_1310 = local_1bc0._48_8_;
        uStack_1308 = local_1bc0._56_8_;
        for (local_1344 = 0; local_1344 + 0xf < local_1294; local_1344 = local_1344 + 0x10) {
          local_b70 = local_11f0;
          uVar3 = *(undefined8 *)local_11f0;
          uVar2 = *(undefined8 *)(local_11f0 + 2);
          uVar4 = *(undefined8 *)(local_11f0 + 4);
          uVar5 = *(undefined8 *)(local_11f0 + 6);
          uVar6 = *(undefined8 *)(local_11f0 + 8);
          uVar7 = *(undefined8 *)(local_11f0 + 10);
          uVar8 = *(undefined8 *)(local_11f0 + 0xc);
          uVar9 = *(undefined8 *)(local_11f0 + 0xe);
          local_13c0 = uVar3;
          uStack_13b8 = uVar2;
          uStack_13b0 = uVar4;
          uStack_13a8 = uVar5;
          uStack_13a0 = uVar6;
          uStack_1398 = uVar7;
          uStack_1390 = uVar8;
          uStack_1388 = uVar9;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16(this_01,x,y_01);
          local_9c8 = local_1248;
          *(undefined8 *)local_1248 = uVar3;
          *(undefined8 *)(local_1248 + 2) = uVar2;
          *(undefined8 *)(local_1248 + 4) = uVar4;
          *(undefined8 *)(local_1248 + 6) = uVar5;
          *(undefined8 *)(local_1248 + 8) = uVar6;
          *(undefined8 *)(local_1248 + 10) = uVar7;
          *(undefined8 *)(local_1248 + 0xc) = uVar8;
          *(undefined8 *)(local_1248 + 0xe) = uVar9;
          local_11f0 = local_11f0 + 0x10;
          local_1248 = local_1248 + 0x10;
          local_1400 = uVar3;
          uStack_13f8 = uVar2;
          uStack_13f0 = uVar4;
          uStack_13e8 = uVar5;
          uStack_13e0 = uVar6;
          uStack_13d8 = uVar7;
          uStack_13d0 = uVar8;
          uStack_13c8 = uVar9;
          local_a40 = uVar3;
          uStack_a38 = uVar2;
          uStack_a30 = uVar4;
          uStack_a28 = uVar5;
          uStack_a20 = uVar6;
          uStack_a18 = uVar7;
          uStack_a10 = uVar8;
          uStack_a08 = uVar9;
        }
        for (; local_1344 + 7 < local_1294; local_1344 = local_1344 + 8) {
          local_8d0 = local_11f0;
          uVar3 = *(undefined8 *)local_11f0;
          uVar2 = *(undefined8 *)(local_11f0 + 2);
          uVar4 = *(undefined8 *)(local_11f0 + 4);
          uVar5 = *(undefined8 *)(local_11f0 + 6);
          local_1420 = uVar3;
          uStack_1418 = uVar2;
          uStack_1410 = uVar4;
          uStack_1408 = uVar5;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8(this_00,(__m256 *)this,y_00);
          local_7e8 = local_1248;
          *(undefined8 *)local_1248 = uVar3;
          *(undefined8 *)(local_1248 + 2) = uVar2;
          *(undefined8 *)(local_1248 + 4) = uVar4;
          *(undefined8 *)(local_1248 + 6) = uVar5;
          local_11f0 = local_11f0 + 8;
          local_1248 = local_1248 + 8;
          local_1440 = uVar3;
          uStack_1438 = uVar2;
          uStack_1430 = uVar4;
          uStack_1428 = uVar5;
          local_820 = uVar3;
          uStack_818 = uVar2;
          uStack_810 = uVar4;
          uStack_808 = uVar5;
        }
        for (; local_1344 + 3 < local_1294; local_1344 = local_1344 + 4) {
          local_220 = local_11f0;
          local_1450 = *(float (*) [2])local_11f0;
          uVar3 = *(undefined8 *)(local_11f0 + 2);
          afStack_1448 = (float  [2])uVar3;
          afVar10 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                              (local_da9,(__m128 *)local_1450,(__m128 *)local_12b0);
          local_1460 = afVar10._0_8_;
          local_98 = local_1248;
          *(undefined8 *)local_1248 = local_1460;
          *(undefined8 *)(local_1248 + 2) = uVar3;
          local_11f0 = local_11f0 + 4;
          local_1248 = local_1248 + 4;
          afStack_1458 = (float  [2])uVar3;
          local_b0 = local_1460;
          afStack_a8._0_8_ = uVar3;
        }
        for (; local_1344 < local_1294; local_1344 = local_1344 + 1) {
          fVar1 = BinaryOp_x86_avx512_functor::binary_op_rpow::func(this,*y_00,(float *)0x10cf347);
          *local_1248 = fVar1;
          local_11f0 = local_11f0 + 1;
          local_1248 = local_1248 + 1;
        }
      }
    }
  }
  if (((int)local_d90[5] == 4) && ((int)local_d98[5] == 2)) {
    for (local_1464 = 0; local_1464 < local_dbc; local_1464 = local_1464 + 1) {
      local_d28 = &local_14b8;
      local_54c = *(int *)((long)local_d90 + 0x2c);
      local_550 = (int)local_d90[6];
      local_554 = *(undefined4 *)((long)local_d90 + 0x34);
      local_1470 = (float *)(*local_d90 + local_d90[8] * (long)local_1464 * local_d90[2]);
      local_568 = local_d90[2];
      local_56c = (undefined4)local_d90[3];
      local_578 = local_d90[4];
      local_548 = &local_14b8;
      local_4a8 = (long)local_54c * (long)local_550 * local_568;
      local_ce8 = &local_14b8;
      local_c58 = &local_14b8;
      local_14c0 = *local_d98 +
                   (long)*(int *)((long)local_d98 + 0x2c) * (long)local_1464 * local_d98[2];
      local_c00 = &local_1510;
      local_62c = *(int *)((long)local_da0 + 0x2c);
      local_630 = (int)local_da0[6];
      local_634 = *(undefined4 *)((long)local_da0 + 0x34);
      local_14c8 = (float *)(*local_da0 + local_da0[8] * (long)local_1464 * local_da0[2]);
      local_648 = local_da0[2];
      local_64c = (undefined4)local_da0[3];
      local_658 = local_da0[4];
      local_628 = &local_1510;
      local_468 = (long)local_62c * (long)local_630 * local_648;
      local_ba8 = &local_1510;
      local_c50 = &local_1510;
      local_1480 = 0;
      local_1484 = 0;
      local_1488 = 0;
      local_148c = 0;
      local_14a0 = 0;
      local_14a8 = 0;
      local_14b0 = 0;
      local_14b8 = 0;
      local_27c = local_1464;
      local_46c = 0x10;
      local_4ac = 0x10;
      local_c0c = local_1464;
      local_c0d = 1;
      local_d34 = local_1464;
      local_d35 = 1;
      local_1478 = 0;
      local_1490 = 0;
      local_1510 = 0;
      local_1500 = 0;
      local_14f8 = 0;
      local_14e8 = 0;
      local_14e4 = 0;
      local_14e0 = 0;
      local_14dc = 0;
      local_14d8 = 0;
      local_14d0 = 0;
      local_1508 = 0;
      local_1514 = local_db0 * local_db4 * local_dc0;
      local_640 = local_14c8;
      local_560 = local_1470;
      local_3c8 = local_c50;
      local_3b8 = local_c58;
      local_14f0 = local_658;
      local_1498 = local_578;
      for (local_1518 = 0; local_1518 < local_db8; local_1518 = local_1518 + 1) {
        local_151c = *(float *)(local_14c0 + (long)local_1518 * 4);
        if (local_dc0 == 4) {
          local_228 = (float *)(local_14c0 + (long)(local_1518 << 2) * 4);
          local_1c20 = *(float (*) [2])local_228;
          afStack_1c18._0_8_ = *(undefined8 *)(local_228 + 2);
        }
        else {
          local_1c20[1] = local_151c;
          local_1c20[0] = local_151c;
          afStack_1c18[1] = local_151c;
          afStack_1c18[0] = local_151c;
          local_740 = local_151c;
          fStack_73c = local_151c;
          fStack_738 = local_151c;
          fStack_734 = local_151c;
          local_724 = local_151c;
        }
        local_1530[0] = local_1c20[0];
        local_1530[1] = local_1c20[1];
        afStack_1528[0] = afStack_1c18[0];
        afStack_1528[1] = afStack_1c18[1];
        if (local_dc0 == 8) {
          local_8d8 = (undefined1 (*) [32])(local_14c0 + (long)(local_1518 << 3) * 4);
          local_1c40 = *local_8d8;
        }
        else {
          local_1e0[0] = local_1c20[0];
          local_1e0[1] = local_1c20[1];
          afStack_1d8[0] = afStack_1c18[0];
          afStack_1d8[1] = afStack_1c18[1];
          local_1c40._8_4_ = afStack_1c18[0];
          local_1c40._12_4_ = afStack_1c18[1];
          local_1c40._0_4_ = local_1c20[0];
          local_1c40._4_4_ = local_1c20[1];
          local_1c40._24_4_ = afStack_1c18[0];
          local_1c40._28_4_ = afStack_1c18[1];
          local_1c40._16_4_ = local_1c20[0];
          local_1c40._20_4_ = local_1c20[1];
        }
        local_1560 = local_1c40._0_8_;
        uStack_1558 = local_1c40._8_8_;
        uStack_1550 = local_1c40._16_8_;
        uStack_1548 = local_1c40._24_8_;
        if (local_dc0 == 0x10) {
          local_b78 = (undefined1 (*) [64])(local_14c0 + (long)(local_1518 << 4) * 4);
          local_1c80 = *local_b78;
        }
        else {
          local_180 = local_1c40._0_8_;
          uStack_178 = local_1c40._8_8_;
          uStack_170 = local_1c40._16_8_;
          uStack_168 = local_1c40._24_8_;
          local_1c80 = vinsertf64x4_avx512f(ZEXT3264(local_1c40),local_1c40,1);
        }
        local_15c0 = local_1c80._0_8_;
        uStack_15b8 = local_1c80._8_8_;
        uStack_15b0 = local_1c80._16_8_;
        uStack_15a8 = local_1c80._24_8_;
        uStack_15a0 = local_1c80._32_8_;
        uStack_1598 = local_1c80._40_8_;
        uStack_1590 = local_1c80._48_8_;
        uStack_1588 = local_1c80._56_8_;
        for (local_15c4 = 0; local_15c4 + 0xf < local_1514; local_15c4 = local_15c4 + 0x10) {
          local_b80 = local_1470;
          uVar3 = *(undefined8 *)local_1470;
          uVar2 = *(undefined8 *)(local_1470 + 2);
          uVar4 = *(undefined8 *)(local_1470 + 4);
          uVar5 = *(undefined8 *)(local_1470 + 6);
          uVar6 = *(undefined8 *)(local_1470 + 8);
          uVar7 = *(undefined8 *)(local_1470 + 10);
          uVar8 = *(undefined8 *)(local_1470 + 0xc);
          uVar9 = *(undefined8 *)(local_1470 + 0xe);
          local_1640 = uVar3;
          uStack_1638 = uVar2;
          uStack_1630 = uVar4;
          uStack_1628 = uVar5;
          uStack_1620 = uVar6;
          uStack_1618 = uVar7;
          uStack_1610 = uVar8;
          uStack_1608 = uVar9;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16(this_01,x,y_01);
          local_a48 = local_14c8;
          *(undefined8 *)local_14c8 = uVar3;
          *(undefined8 *)(local_14c8 + 2) = uVar2;
          *(undefined8 *)(local_14c8 + 4) = uVar4;
          *(undefined8 *)(local_14c8 + 6) = uVar5;
          *(undefined8 *)(local_14c8 + 8) = uVar6;
          *(undefined8 *)(local_14c8 + 10) = uVar7;
          *(undefined8 *)(local_14c8 + 0xc) = uVar8;
          *(undefined8 *)(local_14c8 + 0xe) = uVar9;
          local_1470 = local_1470 + 0x10;
          local_14c8 = local_14c8 + 0x10;
          local_1680 = uVar3;
          uStack_1678 = uVar2;
          uStack_1670 = uVar4;
          uStack_1668 = uVar5;
          uStack_1660 = uVar6;
          uStack_1658 = uVar7;
          uStack_1650 = uVar8;
          uStack_1648 = uVar9;
          local_ac0 = uVar3;
          uStack_ab8 = uVar2;
          uStack_ab0 = uVar4;
          uStack_aa8 = uVar5;
          uStack_aa0 = uVar6;
          uStack_a98 = uVar7;
          uStack_a90 = uVar8;
          uStack_a88 = uVar9;
        }
        for (; local_15c4 + 7 < local_1514; local_15c4 = local_15c4 + 8) {
          local_8e0 = local_1470;
          uVar3 = *(undefined8 *)local_1470;
          uVar2 = *(undefined8 *)(local_1470 + 2);
          uVar4 = *(undefined8 *)(local_1470 + 4);
          uVar5 = *(undefined8 *)(local_1470 + 6);
          local_16a0 = uVar3;
          uStack_1698 = uVar2;
          uStack_1690 = uVar4;
          uStack_1688 = uVar5;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8(this_00,(__m256 *)this,y_00);
          local_828 = local_14c8;
          *(undefined8 *)local_14c8 = uVar3;
          *(undefined8 *)(local_14c8 + 2) = uVar2;
          *(undefined8 *)(local_14c8 + 4) = uVar4;
          *(undefined8 *)(local_14c8 + 6) = uVar5;
          local_1470 = local_1470 + 8;
          local_14c8 = local_14c8 + 8;
          local_16c0 = uVar3;
          uStack_16b8 = uVar2;
          uStack_16b0 = uVar4;
          uStack_16a8 = uVar5;
          local_860 = uVar3;
          uStack_858 = uVar2;
          uStack_850 = uVar4;
          uStack_848 = uVar5;
        }
        for (; local_15c4 + 3 < local_1514; local_15c4 = local_15c4 + 4) {
          local_230 = local_1470;
          local_16d0 = *(float (*) [2])local_1470;
          uVar3 = *(undefined8 *)(local_1470 + 2);
          afStack_16c8 = (float  [2])uVar3;
          afVar10 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                              (local_da9,(__m128 *)local_16d0,(__m128 *)local_1530);
          local_16e0 = afVar10._0_8_;
          local_b8 = local_14c8;
          *(undefined8 *)local_14c8 = local_16e0;
          *(undefined8 *)(local_14c8 + 2) = uVar3;
          local_1470 = local_1470 + 4;
          local_14c8 = local_14c8 + 4;
          afStack_16d8 = (float  [2])uVar3;
          local_d0 = local_16e0;
          afStack_c8._0_8_ = uVar3;
        }
        for (; local_15c4 < local_1514; local_15c4 = local_15c4 + 1) {
          fVar1 = BinaryOp_x86_avx512_functor::binary_op_rpow::func(this,*y_00,(float *)0x10d01ca);
          *local_14c8 = fVar1;
          local_1470 = local_1470 + 1;
          local_14c8 = local_14c8 + 1;
        }
      }
    }
  }
  if (((int)local_d90[5] == 4) && ((int)local_d98[5] == 3)) {
    for (local_16e4 = 0; local_16e4 < local_dbc; local_16e4 = local_16e4 + 1) {
      local_d40 = &local_1738;
      local_514 = *(int *)((long)local_d90 + 0x2c);
      local_518 = (int)local_d90[6];
      local_51c = *(undefined4 *)((long)local_d90 + 0x34);
      local_16f0 = (float *)(*local_d90 + local_d90[8] * (long)local_16e4 * local_d90[2]);
      local_530 = local_d90[2];
      local_534 = (undefined4)local_d90[3];
      local_540 = local_d90[4];
      local_510 = &local_1738;
      local_4b8 = (long)local_514 * (long)local_518 * local_530;
      local_cf0 = &local_1738;
      local_c48 = &local_1738;
      local_c20 = &local_1788;
      local_5f4 = *(int *)((long)local_da0 + 0x2c);
      local_5f8 = (int)local_da0[6];
      local_5fc = *(undefined4 *)((long)local_da0 + 0x34);
      local_1740 = (float *)(*local_da0 + local_da0[8] * (long)local_16e4 * local_da0[2]);
      local_610 = local_da0[2];
      local_614 = (undefined4)local_da0[3];
      local_620 = local_da0[4];
      local_5f0 = &local_1788;
      local_478 = (long)local_5f4 * (long)local_5f8 * local_610;
      local_bb0 = &local_1788;
      local_c40 = &local_1788;
      local_1700 = 0;
      local_1704 = 0;
      local_1708 = 0;
      local_170c = 0;
      local_1720 = 0;
      local_1728 = 0;
      local_1730 = 0;
      local_1738 = 0;
      local_47c = 0x10;
      local_4bc = 0x10;
      local_c2c = local_16e4;
      local_c2d = 1;
      local_d4c = local_16e4;
      local_d4d = 1;
      local_16f8 = 0;
      local_1710 = 0;
      local_1788 = 0;
      local_1778 = 0;
      local_1770 = 0;
      local_1760 = 0;
      local_175c = 0;
      local_1758 = 0;
      local_1754 = 0;
      local_1750 = 0;
      local_1748 = 0;
      local_1780 = 0;
      local_178c = local_db0 * local_dc0;
      local_608 = local_1740;
      local_528 = local_16f0;
      local_3e8 = local_c40;
      local_3d8 = local_c48;
      local_1768 = local_620;
      local_1718 = local_540;
      for (local_1790 = 0; local_1790 < local_db8; local_1790 = local_1790 + 1) {
        local_d58 = &local_17e0;
        local_4dc = *(int *)((long)local_d98 + 0x2c);
        local_4e0 = (int)local_d98[6];
        local_4e4 = *(undefined4 *)((long)local_d98 + 0x34);
        local_4f0 = *local_d98 + local_d98[8] * (long)local_16e4 * local_d98[2];
        local_4f8 = local_d98[2];
        local_4fc = (undefined4)local_d98[3];
        local_508 = local_d98[4];
        local_4d8 = &local_17e0;
        local_4c8 = (long)local_4dc * (long)local_4e0 * local_4f8;
        local_288 = &local_17e0;
        local_1798 = local_4f0 + (long)local_4dc * (long)local_1790 * local_4f8;
        local_c38 = &local_17e0;
        local_28c = local_1790;
        local_4cc = 0x10;
        local_d64 = local_16e4;
        local_d65 = 1;
        local_17e0 = 0;
        local_17d0 = 0;
        local_17c8 = 0;
        local_17b8 = 0;
        local_17b4 = 0;
        local_17b0 = 0;
        local_17ac = 0;
        local_17a8 = 0;
        local_17a0 = 0;
        local_17d8 = 0;
        local_3f8 = local_c38;
        local_17c0 = local_508;
        for (local_17e4 = 0; local_17e4 < local_db4; local_17e4 = local_17e4 + 1) {
          local_17e8 = *(float *)(local_1798 + (long)local_17e4 * 4);
          if (local_dc0 == 4) {
            local_238 = (float *)(local_1798 + (long)(local_17e4 << 2) * 4);
            local_1d10 = *(float (*) [2])local_238;
            afStack_1d08._0_8_ = *(undefined8 *)(local_238 + 2);
          }
          else {
            local_1d10[1] = local_17e8;
            local_1d10[0] = local_17e8;
            afStack_1d08[1] = local_17e8;
            afStack_1d08[0] = local_17e8;
            local_760 = local_17e8;
            fStack_75c = local_17e8;
            fStack_758 = local_17e8;
            fStack_754 = local_17e8;
            local_744 = local_17e8;
          }
          local_1800[0] = local_1d10[0];
          local_1800[1] = local_1d10[1];
          afStack_17f8[0] = afStack_1d08[0];
          afStack_17f8[1] = afStack_1d08[1];
          if (local_dc0 == 8) {
            local_8e8 = (undefined1 (*) [32])(local_1798 + (long)(local_17e4 << 3) * 4);
            local_1d40 = *local_8e8;
          }
          else {
            local_1f0[0] = local_1d10[0];
            local_1f0[1] = local_1d10[1];
            afStack_1e8[0] = afStack_1d08[0];
            afStack_1e8[1] = afStack_1d08[1];
            local_1d40._8_4_ = afStack_1d08[0];
            local_1d40._12_4_ = afStack_1d08[1];
            local_1d40._0_4_ = local_1d10[0];
            local_1d40._4_4_ = local_1d10[1];
            local_1d40._24_4_ = afStack_1d08[0];
            local_1d40._28_4_ = afStack_1d08[1];
            local_1d40._16_4_ = local_1d10[0];
            local_1d40._20_4_ = local_1d10[1];
          }
          local_1820 = local_1d40._0_8_;
          uStack_1818 = local_1d40._8_8_;
          uStack_1810 = local_1d40._16_8_;
          uStack_1808 = local_1d40._24_8_;
          if (local_dc0 == 0x10) {
            local_b88 = (undefined1 (*) [64])(local_1798 + (long)(local_17e4 << 4) * 4);
            local_1d80 = *local_b88;
          }
          else {
            local_1a0 = local_1d40._0_8_;
            uStack_198 = local_1d40._8_8_;
            uStack_190 = local_1d40._16_8_;
            uStack_188 = local_1d40._24_8_;
            local_1d80 = vinsertf64x4_avx512f(ZEXT3264(local_1d40),local_1d40,1);
          }
          uStack_1868 = uStack_1d68;
          uStack_1848 = uStack_1d48;
          local_1880 = y_00;
          pbStack_1878 = this;
          pbStack_1870 = this_00;
          pafStack_1860 = y_01;
          pafStack_1858 = x;
          pbStack_1850 = this_01;
          for (local_1884 = 0; local_1884 + 0xf < local_178c; local_1884 = local_1884 + 0x10) {
            local_b90 = local_16f0;
            uVar3 = *(undefined8 *)local_16f0;
            uVar2 = *(undefined8 *)(local_16f0 + 2);
            uVar4 = *(undefined8 *)(local_16f0 + 4);
            uVar5 = *(undefined8 *)(local_16f0 + 6);
            uVar6 = *(undefined8 *)(local_16f0 + 8);
            uVar7 = *(undefined8 *)(local_16f0 + 10);
            uVar8 = *(undefined8 *)(local_16f0 + 0xc);
            uVar9 = *(undefined8 *)(local_16f0 + 0xe);
            local_1900 = uVar3;
            uStack_18f8 = uVar2;
            uStack_18f0 = uVar4;
            uStack_18e8 = uVar5;
            uStack_18e0 = uVar6;
            uStack_18d8 = uVar7;
            uStack_18d0 = uVar8;
            uStack_18c8 = uVar9;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16(this_01,x,y_01);
            local_ac8 = local_1740;
            *(undefined8 *)local_1740 = uVar3;
            *(undefined8 *)(local_1740 + 2) = uVar2;
            *(undefined8 *)(local_1740 + 4) = uVar4;
            *(undefined8 *)(local_1740 + 6) = uVar5;
            *(undefined8 *)(local_1740 + 8) = uVar6;
            *(undefined8 *)(local_1740 + 10) = uVar7;
            *(undefined8 *)(local_1740 + 0xc) = uVar8;
            *(undefined8 *)(local_1740 + 0xe) = uVar9;
            local_16f0 = local_16f0 + 0x10;
            local_1740 = local_1740 + 0x10;
            local_1940 = uVar3;
            uStack_1938 = uVar2;
            uStack_1930 = uVar4;
            uStack_1928 = uVar5;
            uStack_1920 = uVar6;
            uStack_1918 = uVar7;
            uStack_1910 = uVar8;
            uStack_1908 = uVar9;
            local_b40 = uVar3;
            uStack_b38 = uVar2;
            uStack_b30 = uVar4;
            uStack_b28 = uVar5;
            uStack_b20 = uVar6;
            uStack_b18 = uVar7;
            uStack_b10 = uVar8;
            uStack_b08 = uVar9;
          }
          for (; local_1884 + 7 < local_178c; local_1884 = local_1884 + 8) {
            local_8f0 = local_16f0;
            uVar3 = *(undefined8 *)local_16f0;
            uVar2 = *(undefined8 *)(local_16f0 + 2);
            uVar4 = *(undefined8 *)(local_16f0 + 4);
            uVar5 = *(undefined8 *)(local_16f0 + 6);
            local_1960 = uVar3;
            uStack_1958 = uVar2;
            uStack_1950 = uVar4;
            uStack_1948 = uVar5;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8(this_00,(__m256 *)this,y_00);
            local_868 = local_1740;
            *(undefined8 *)local_1740 = uVar3;
            *(undefined8 *)(local_1740 + 2) = uVar2;
            *(undefined8 *)(local_1740 + 4) = uVar4;
            *(undefined8 *)(local_1740 + 6) = uVar5;
            local_16f0 = local_16f0 + 8;
            local_1740 = local_1740 + 8;
            local_1980 = uVar3;
            uStack_1978 = uVar2;
            uStack_1970 = uVar4;
            uStack_1968 = uVar5;
            local_8a0 = uVar3;
            uStack_898 = uVar2;
            uStack_890 = uVar4;
            uStack_888 = uVar5;
          }
          for (; local_1884 + 3 < local_178c; local_1884 = local_1884 + 4) {
            local_240 = local_16f0;
            local_1990 = *(float (*) [2])local_16f0;
            uVar3 = *(undefined8 *)(local_16f0 + 2);
            afStack_1988 = (float  [2])uVar3;
            afVar10 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                (local_da9,(__m128 *)local_1990,(__m128 *)local_1800);
            local_f0 = afVar10._0_8_;
            local_d8 = local_1740;
            *(undefined8 *)local_1740 = local_f0;
            *(undefined8 *)(local_1740 + 2) = uVar3;
            local_16f0 = local_16f0 + 4;
            local_1740 = local_1740 + 4;
            afStack_e8._0_8_ = uVar3;
          }
          for (; local_1884 < local_178c; local_1884 = local_1884 + 1) {
            fVar1 = BinaryOp_x86_avx512_functor::binary_op_rpow::func(this,*y_00,(float *)0x10d1485)
            ;
            *local_1740 = fVar1;
            local_16f0 = local_16f0 + 1;
            local_1740 = local_1740 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 8
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            float* outptr = c.row(y);

            const float _b = b[y];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + y * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const float _b = b[q];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + q * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * h * d * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int y = 0; y < h; y++)
            {
                const float _b = ptr1[y];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * h * elempack;

            for (int z = 0; z < d; z++)
            {
                const float _b = ptr1[z];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + z * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + z * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + z * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int z = 0; z < d; z++)
            {
                const float* ptr1 = b.channel(q).row(z);

                for (int y = 0; y < h; y++)
                {
                    const float _b = ptr1[y];
#if __SSE2__
                    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        __m512 _outp = op.func_pack16(_p, _b_512);
                        _mm512_storeu_ps(outptr, _outp);
                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _outp = op.func_pack8(_p, _b_256);
                        _mm256_storeu_ps(outptr, _outp);
                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        __m128 _outp = op.func_pack4(_p, _b_128);
                        _mm_storeu_ps(outptr, _outp);
                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr = op.func(*ptr, _b);
                        ptr += 1;
                        outptr += 1;
                    }
                }
            }
        }
    }

    return 0;
}